

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjIterLookupTable::getp_get_cur_key
          (CVmObjIterLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDI;
  CVmObjIterLookupTable *unaff_retaddr;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *keyp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  keyp = in_RDI;
  if ((getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_cur_key::desc,0);
    __cxa_guard_release(&getp_get_cur_key(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,&in_RDI->typ,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    get_cur_entry(unaff_retaddr,
                  (vm_val_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),keyp);
  }
  return 1;
}

Assistant:

int CVmObjIterLookupTable::getp_get_cur_key(VMG_ vm_obj_id_t self,
                                            vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the entry's key */
    get_cur_entry(vmg_ 0, retval);

    /* handled */
    return TRUE;
}